

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_socket.cpp
# Opt level: O3

void booster::aio::socket_pair(stream_socket *s1,stream_socket *s2)

{
  int iVar1;
  undefined8 in_RAX;
  system_error *this;
  uint *puVar2;
  error_code eVar3;
  int fds [2];
  undefined8 local_18;
  
  local_18 = in_RAX;
  iVar1 = socketpair(1,1,0,(int *)&local_18);
  if (-1 < iVar1) {
    basic_io_device::assign((basic_io_device *)s1,(native_type)local_18);
    basic_io_device::assign((basic_io_device *)s2,local_18._4_4_);
    return;
  }
  this = (system_error *)__cxa_allocate_exception(0x40);
  puVar2 = (uint *)__errno_location();
  eVar3._4_4_ = 0;
  eVar3._M_value = *puVar2;
  eVar3._M_cat = syscat;
  system::system_error::system_error(this,eVar3);
  __cxa_throw(this,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void socket_pair(stream_socket &s1,stream_socket &s2)
{
#ifdef BOOSTER_AIO_NO_PF_UNIX
	acceptor a;
	a.open(pf_inet);
	a.set_option(acceptor::reuse_address,true);
	a.bind(endpoint("127.0.0.1",0));
	a.listen(1);
	s1.open(pf_inet);
	s1.connect(a.local_endpoint());
	a.accept(s2);
	a.close();
#else
	int fds[2];
	if(::socketpair(AF_UNIX,SOCK_STREAM,0,fds) < 0)
		throw system::system_error(geterror());
	s1.assign(fds[0]);
	s2.assign(fds[1]);
#endif
}